

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pki.cpp
# Opt level: O3

Url * __thiscall Vault::Pki::getUrl(Url *__return_storage_ptr__,Pki *this,Path *path)

{
  long *plVar1;
  size_type sVar2;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  plVar1 = *(long **)this;
  Vault::operator+(&local_40,"/v1/",
                   (Tiny<Vault::SecretMountDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 8));
  sVar2 = (path->value_)._M_string_length;
  if (sVar2 == 0) {
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,(path->value_)._M_dataplus._M_p);
  }
  else {
    Vault::operator+(&local_80,"/",path);
    local_60 = &local_50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      local_50._8_8_ = local_80.field_2._8_8_;
    }
    else {
      local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_80._M_dataplus._M_p;
    }
    local_50._M_allocated_capacity._1_7_ = local_80.field_2._M_allocated_capacity._1_7_;
    local_50._M_local_buf[0] = local_80.field_2._M_local_buf[0];
    local_58 = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,&local_40,&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50._M_allocated_capacity + 1);
  }
  if ((sVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Pki::getUrl(const Path &path) const {
  return client_.getUrl("/v1/" + secretMount_,
                        path.empty() ? path : Path{"/" + path});
}